

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O2

uint32_t FACTCue_SetMatrixCoefficients
                   (FACTCue *pCue,uint32_t uSrcChannelCount,uint32_t uDstChannelCount,
                   float *pMatrixCoefficients)

{
  FACTWave *pWave;
  FACTSoundInstance *pFVar1;
  long lVar2;
  ulong uVar3;
  
  FAudio_PlatformLockMutex(pCue->parentBank->parentEngine->apiLock);
  pCue->srcChannels = uSrcChannelCount;
  pCue->dstChannels = uDstChannelCount;
  SDL_memcpy(pCue->matrixCoefficients,pMatrixCoefficients,
             (ulong)uDstChannelCount * (ulong)uSrcChannelCount * 4);
  pCue->active3D = '\x01';
  if (pCue->simpleWave == (FACTWave *)0x0) {
    pFVar1 = pCue->playingSound;
    if (pFVar1 != (FACTSoundInstance *)0x0) {
      lVar2 = 0x28;
      for (uVar3 = 0; uVar3 < pFVar1->sound->trackCount; uVar3 = uVar3 + 1) {
        pWave = *(FACTWave **)((long)&pFVar1->tracks->events + lVar2);
        if (pWave != (FACTWave *)0x0) {
          FACTWave_SetMatrixCoefficients
                    (pWave,uSrcChannelCount,uDstChannelCount,pMatrixCoefficients);
          pFVar1 = pCue->playingSound;
        }
        lVar2 = lVar2 + 0x68;
      }
    }
  }
  else {
    FACTWave_SetMatrixCoefficients
              (pCue->simpleWave,uSrcChannelCount,uDstChannelCount,pMatrixCoefficients);
  }
  FAudio_PlatformUnlockMutex(pCue->parentBank->parentEngine->apiLock);
  return 0;
}

Assistant:

uint32_t FACTCue_SetMatrixCoefficients(
	FACTCue *pCue,
	uint32_t uSrcChannelCount,
	uint32_t uDstChannelCount,
	float *pMatrixCoefficients
) {
	uint8_t i;

	FAudio_PlatformLockMutex(pCue->parentBank->parentEngine->apiLock);

	/* See FACTCue.matrixCoefficients declaration */
	FAudio_assert(uSrcChannelCount > 0 && uSrcChannelCount < 3);
	FAudio_assert(uDstChannelCount > 0 && uDstChannelCount < 9);

	/* Local storage */
	pCue->srcChannels = uSrcChannelCount;
	pCue->dstChannels = uDstChannelCount;
	FAudio_memcpy(
		pCue->matrixCoefficients,
		pMatrixCoefficients,
		sizeof(float) * uSrcChannelCount * uDstChannelCount
	);
	pCue->active3D = 1;

	/* Apply to Waves if they exist */
	if (pCue->simpleWave != NULL)
	{
		FACTWave_SetMatrixCoefficients(
			pCue->simpleWave,
			uSrcChannelCount,
			uDstChannelCount,
			pMatrixCoefficients
		);
	}
	else if (pCue->playingSound != NULL)
	{
		for (i = 0; i < pCue->playingSound->sound->trackCount; i += 1)
		{
			if (pCue->playingSound->tracks[i].activeWave.wave != NULL)
			{
				FACTWave_SetMatrixCoefficients(
					pCue->playingSound->tracks[i].activeWave.wave,
					uSrcChannelCount,
					uDstChannelCount,
					pMatrixCoefficients
				);
			}
		}
	}

	FAudio_PlatformUnlockMutex(pCue->parentBank->parentEngine->apiLock);
	return 0;
}